

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

int __thiscall
CEditor::DoProperties(CEditor *this,CUIRect *pToolBox,CProperty *pProps,int *pIDs,int *pNewVal)

{
  CUI *this_00;
  vec3 *pvVar1;
  vec3 *pvVar2;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 *paVar3;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 *paVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte bVar7;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar8;
  int iVar9;
  uint uVar10;
  uint Checked;
  char *pText;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar25;
  CUIRect Down;
  CUIRect Up;
  CUIRect Yes;
  CUIRect Shifter;
  CUIRect Label;
  CUIRect Slot;
  CUIRect No;
  int *local_f8;
  vec4 local_e8;
  vec4 local_d8;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_c8;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aStack_c4;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_c0;
  anon_union_4_2_94730017_for_vector4_base<float>_7 local_bc;
  CUIRect local_b8;
  CUIRect local_a8;
  CUIRect local_98;
  CUIRect local_88;
  CUIRect local_78 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pProps->m_pName == (char *)0x0) {
    iVar9 = -1;
  }
  else {
    this_00 = &this->m_UI;
    pvVar1 = &this->m_InitialPickerColor;
    pvVar2 = &this->m_SelectedPickerColor;
    uVar15 = 0xffffffff;
    uVar13 = 0;
    local_f8 = pIDs;
    do {
      CUIRect::HSplitTop(pToolBox,13.0,&local_88,pToolBox);
      CUIRect::VSplitMid(&local_88,&local_98,&local_a8,0.0);
      CUIRect::HMargin(&local_a8,1.0,&local_a8);
      CUI::DoLabel(this_00,&local_98,pProps[uVar13].m_pName,10.0,0,-1.0,true);
      switch(pProps[uVar13].m_Type) {
      case 1:
        CUIRect::VSplitMid(&local_a8,local_78,&local_b8,0.0);
        iVar9 = DoButton_ButtonDec(this,pIDs + uVar13,"No",(uint)(pProps[uVar13].m_Value == 0),
                                   local_78,0,"");
        if (iVar9 != 0) {
          *pNewVal = 0;
          uVar15 = uVar13 & 0xffffffff;
        }
        iVar9 = DoButton_ButtonInc(this,(void *)((long)(pIDs + uVar13) + 1),"Yes",
                                   pProps[uVar13].m_Value,&local_b8,0,"");
        if (iVar9 != 0) {
          *pNewVal = 1;
LAB_0019985b:
          uVar15 = uVar13 & 0xffffffff;
        }
        break;
      case 2:
        CUIRect::VSplitRight(&local_a8,10.0,&local_a8,&local_b8);
        CUIRect::VSplitLeft(&local_a8,10.0,(CUIRect *)&local_c8,&local_a8);
        str_format((char *)local_78,0x40,"%d",(ulong)(uint)pProps[uVar13].m_Value);
        local_d8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_d8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_d8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_d8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&local_a8,&local_d8,0.0,0);
        CUI::DoLabel(this_00,&local_a8,(char *)local_78,10.0,1,-1.0,true);
        iVar9 = DoButton_ButtonDec(this,pIDs + uVar13,(char *)0x0,0,(CUIRect *)&local_c8,0,
                                   "Decrease");
        if (iVar9 != 0) {
          *pNewVal = pProps[uVar13].m_Value + -1;
          uVar15 = uVar13 & 0xffffffff;
        }
        iVar9 = DoButton_ButtonInc(this,(void *)((long)(pIDs + uVar13) + 1),(char *)0x0,0,&local_b8,
                                   0,"Increase");
        if (iVar9 != 0) {
          *pNewVal = pProps[uVar13].m_Value + 1;
          goto LAB_0019985b;
        }
        break;
      case 3:
        iVar9 = UiDoValueSelector(this,pIDs + uVar13,&local_a8,"",pProps[uVar13].m_Value,
                                  pProps[uVar13].m_Min,pProps[uVar13].m_Max,1,1.0,
                                  "Use left mouse button to drag and change the value. Hold shift to be more precise."
                                 );
        if (iVar9 != pProps[uVar13].m_Value) {
LAB_00199b65:
          *pNewVal = iVar9;
          uVar15 = uVar13 & 0xffffffff;
        }
        break;
      case 4:
        CUIRect::HSplitTop(pToolBox,39.0,&local_88,pToolBox);
        CUIRect::VSplitMid(&local_88,local_78,&local_b8,0.0);
        CUIRect::HMargin(local_78,1.0,local_78);
        CUIRect::VMargin(local_78,6.0,local_78);
        lVar14 = 0;
        uVar11 = 0;
        piVar12 = local_f8;
        while( true ) {
          bVar7 = *(byte *)((long)DoProperties::s_aShift + lVar14);
          iVar9 = UiDoValueSelector(this,piVar12,&local_a8,
                                    (char *)((long)&
                                                  _ZZN7CEditor12DoPropertiesEP7CUIRectP9CPropertyPiS4_E9s_paTexts_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN7CEditor12DoPropertiesEP7CUIRectP9CPropertyPiS4_E9s_paTexts_rel
                                                  + lVar14)),
                                    pProps[uVar13].m_Value >> (bVar7 & 0x1f) & 0xff,0,0xff,1,1.0,
                                    "Use left mouse button to drag and change the color value. Hold shift to be more precise."
                                   );
          uVar11 = iVar9 << (bVar7 & 0x1f) | uVar11;
          if (lVar14 == 0xc) break;
          CUIRect::HSplitTop(&local_b8,13.0,&local_a8,&local_b8);
          CUIRect::HMargin(&local_a8,1.0,&local_a8);
          lVar14 = lVar14 + 4;
          piVar12 = (int *)((long)piVar12 + 1);
        }
        uVar10 = pProps[uVar13].m_Value;
        Checked = uVar10 >> 0x18;
        local_c0.x = (float)(uVar10 >> 8 & 0xff) / 255.0;
        auVar21._0_4_ = (float)Checked;
        auVar21._4_4_ = (float)(uVar10 >> 0x10 & 0xff);
        auVar21._8_8_ = 0;
        auVar21 = divps(auVar21,_DAT_001da050);
        _local_c8 = auVar21._0_8_;
        local_bc.w = 1.0;
        CUIRect::Draw(local_78,(vec4 *)&local_c8,0.0,0);
        iVar9 = DoButton_Editor_Common
                          (this,&DoProperties::s_ColorPicker,pText,Checked,local_78,0,(char *)0x0);
        if (iVar9 != 0) {
          aVar25 = local_c8;
          if (aStack_c4.x <= local_c8.x) {
            aVar25 = aStack_c4;
          }
          if (local_c0.x <= aVar25.x) {
            aVar25 = local_c0;
          }
          aVar16 = local_c8;
          if (local_c8.x <= aStack_c4.x) {
            aVar16 = aStack_c4;
          }
          if (aVar16.x <= local_c0.x) {
            aVar16 = local_c0;
          }
          fVar19 = aVar16.x - aVar25.x;
          if ((aVar16.x != aVar25.x) || (NAN(aVar16.x) || NAN(aVar25.x))) {
            if ((aVar16.x != local_c8.x) || (NAN(aVar16.x) || NAN(local_c8.x))) {
              if ((aVar16.x != aStack_c4.x) || (NAN(aVar16.x) || NAN(aStack_c4.x))) {
                fVar22 = (local_c8.x - aStack_c4.x) / fVar19 + 4.0;
              }
              else {
                fVar22 = (local_c0.x - local_c8.x) / fVar19 + 2.0;
              }
            }
            else {
              fVar22 = (aStack_c4.x - local_c0.x) / fVar19;
            }
          }
          else {
            fVar22 = 0.0;
          }
          fVar22 = fVar22 / 6.0;
          (this->m_InitialPickerColor).field_0 =
               (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)
               (~-(uint)(fVar22 < 0.0) & (uint)fVar22 | (uint)(fVar22 + 1.0) & -(uint)(fVar22 < 0.0)
               );
          (this->m_InitialPickerColor).field_1 =
               (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)
               (-(uint)(aVar16.x != 0.0) & (uint)(fVar19 / aVar16.x));
          (this->m_InitialPickerColor).field_2.z = (float)aVar16;
          (this->m_SelectedPickerColor).field_2 = (this->m_InitialPickerColor).field_2;
          aVar8 = pvVar1->field_1;
          pvVar2->field_0 = pvVar1->field_0;
          pvVar2->field_1 = aVar8;
          CUI::DoPopupMenu(this_00,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0xb4,0xb4,
                           this,PopupColorPicker,0xf);
        }
        if (((pvVar1->field_0).x != (pvVar2->field_0).x) ||
           (NAN((pvVar1->field_0).x) || NAN((pvVar2->field_0).x))) {
LAB_00199c8e:
          (this->m_InitialPickerColor).field_2 = (this->m_SelectedPickerColor).field_2;
          aVar8 = pvVar2->field_1;
          pvVar1->field_0 = pvVar2->field_0;
          pvVar1->field_1 = aVar8;
          uVar5 = (this->m_SelectedPickerColor).field_0;
          uVar6 = (this->m_SelectedPickerColor).field_1;
          fVar19 = (float)uVar5 * 6.0;
          if ((uint)((int)fVar19 % 6) < 6) {
            fVar22 = (this->m_SelectedPickerColor).field_2.z;
            fVar20 = (1.0 - (float)uVar6) * fVar22;
            fVar24 = (1.0 - (float)uVar6 * (fVar19 - (float)(int)fVar19)) * fVar22;
            fVar23 = (1.0 - (1.0 - (fVar19 - (float)(int)fVar19)) * (float)uVar6) * fVar22;
            fVar17 = fVar22;
            fVar18 = fVar22;
            switch((int)fVar19 % 6) {
            case 0:
              fVar18 = fVar23;
              fVar22 = fVar20;
              break;
            case 1:
              fVar17 = fVar24;
              fVar22 = fVar20;
              break;
            case 2:
              fVar17 = fVar20;
              fVar22 = fVar23;
              break;
            case 3:
              fVar17 = fVar20;
              fVar18 = fVar24;
              break;
            case 4:
              fVar17 = fVar23;
              fVar18 = fVar20;
              break;
            case 5:
              fVar18 = fVar20;
              fVar22 = fVar24;
            }
          }
          else {
            fVar17 = 0.0;
            fVar18 = 0.0;
            fVar22 = 0.0;
          }
          uVar10 = pProps[uVar13].m_Value;
          uVar11 = uVar10 & 0xff |
                   ((int)(fVar22 * 255.0) & 0xffU) << 8 |
                   ((int)(fVar18 * 255.0) & 0xffU) << 0x10 | (int)(fVar17 * 255.0) << 0x18;
        }
        else {
          fVar19 = (this->m_InitialPickerColor).field_1.y;
          paVar3 = &(this->m_SelectedPickerColor).field_1;
          if ((fVar19 != paVar3->y) || (NAN(fVar19) || NAN(paVar3->y))) goto LAB_00199c8e;
          fVar19 = (this->m_InitialPickerColor).field_2.z;
          paVar4 = &(this->m_SelectedPickerColor).field_2;
          if ((fVar19 != paVar4->z) || (NAN(fVar19) || NAN(paVar4->z))) goto LAB_00199c8e;
          uVar10 = pProps[uVar13].m_Value;
        }
        if (uVar11 != uVar10) {
          *pNewVal = uVar11;
LAB_00199dd1:
          uVar15 = uVar13 & 0xffffffff;
        }
        break;
      case 5:
        if (pProps[uVar13].m_Value < 0) {
          str_copy((char *)local_78,"None",0x40);
        }
        else {
          str_format((char *)local_78,0x40,"%s");
        }
        iVar9 = DoButton_Editor(this,pIDs + uVar13,(char *)local_78,0,&local_a8,0,(char *)0x0);
        if (iVar9 != 0) {
          PopupSelectImageInvoke
                    (this,pProps[uVar13].m_Value,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
        }
        iVar9 = PopupSelectImageResult(this);
        if (-2 < iVar9) goto LAB_00199b65;
        break;
      case 7:
        CUIRect::VSplitMid(&local_a8,local_78,(CUIRect *)&local_c8,2.0);
        CUIRect::VSplitLeft(local_78,10.0,local_78,&local_a8);
        CUIRect::VSplitRight(&local_a8,10.0,&local_a8,&local_b8);
        local_d8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_d8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_d8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_d8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&local_a8,&local_d8,0.0,0);
        CUI::DoLabel(this_00,&local_a8,"X",10.0,1,-1.0,true);
        CUIRect::VSplitLeft((CUIRect *)&local_c8,10.0,(CUIRect *)&local_c8,&local_a8);
        CUIRect::VSplitRight(&local_a8,10.0,&local_a8,(CUIRect *)&local_d8);
        local_e8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
        local_e8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
        local_e8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
        local_e8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
        CUIRect::Draw(&local_a8,&local_e8,0.0,0);
        CUI::DoLabel(this_00,&local_a8,"Y",10.0,1,-1.0,true);
        piVar12 = pIDs + uVar13;
        iVar9 = DoButton_ButtonDec(this,piVar12,"-",0,local_78,0,"Left");
        if (iVar9 != 0) {
          *pNewVal = 1;
          uVar15 = uVar13 & 0xffffffff;
        }
        iVar9 = DoButton_ButtonInc(this,(void *)((long)piVar12 + 3),"+",0,&local_b8,0,"Right");
        if (iVar9 != 0) {
          *pNewVal = 2;
          uVar15 = uVar13 & 0xffffffff;
        }
        iVar9 = DoButton_ButtonDec(this,(void *)((long)piVar12 + 1),"-",0,(CUIRect *)&local_c8,0,
                                   "Up");
        if (iVar9 != 0) {
          *pNewVal = 4;
          uVar15 = uVar13 & 0xffffffff;
        }
        iVar9 = DoButton_ButtonInc(this,(void *)((long)piVar12 + 2),"+",0,(CUIRect *)&local_d8,0,
                                   "Down");
        if (iVar9 != 0) {
          *pNewVal = 8;
          goto LAB_00199dd1;
        }
      }
      iVar9 = (int)uVar15;
      uVar13 = uVar13 + 1;
      local_f8 = local_f8 + 1;
    } while (pProps[uVar13].m_pName != (char *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
}

Assistant:

int CEditor::DoProperties(CUIRect *pToolBox, CProperty *pProps, int *pIDs, int *pNewVal)
{
	int Change = -1;

	for(int i = 0; pProps[i].m_pName; i++)
	{
		CUIRect Slot;
		pToolBox->HSplitTop(13.0f, &Slot, pToolBox);
		CUIRect Label, Shifter;
		Slot.VSplitMid(&Label, &Shifter);
		Shifter.HMargin(1.0f, &Shifter);
		UI()->DoLabel(&Label, pProps[i].m_pName, 10.0f, TEXTALIGN_LEFT);

		if(pProps[i].m_Type == PROPTYPE_INT_STEP)
		{
			CUIRect Inc, Dec;
			char aBuf[64];

			Shifter.VSplitRight(10.0f, &Shifter, &Inc);
			Shifter.VSplitLeft(10.0f, &Dec, &Shifter);
			str_format(aBuf, sizeof(aBuf),"%d", pProps[i].m_Value);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, aBuf, 10.0f,TEXTALIGN_CENTER);

			if(DoButton_ButtonDec(&pIDs[i], 0, 0, &Dec, 0, "Decrease"))
			{
				*pNewVal = pProps[i].m_Value-1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, 0, 0, &Inc, 0, "Increase"))
			{
				*pNewVal = pProps[i].m_Value+1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_BOOL)
		{
			CUIRect No, Yes;
			Shifter.VSplitMid(&No, &Yes);
			if(DoButton_ButtonDec(&pIDs[i], "No", !pProps[i].m_Value, &No, 0, ""))
			{
				*pNewVal = 0;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+1, "Yes", pProps[i].m_Value, &Yes, 0, ""))
			{
				*pNewVal = 1;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_INT_SCROLL)
		{
			int NewValue = UiDoValueSelector(&pIDs[i], &Shifter, "", pProps[i].m_Value, pProps[i].m_Min, pProps[i].m_Max, 1, 1.0f, "Use left mouse button to drag and change the value. Hold shift to be more precise.");
			if(NewValue != pProps[i].m_Value)
			{
				*pNewVal = NewValue;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_COLOR)
		{
			static const char *s_paTexts[4] = {"R", "G", "B", "A"};
			static int s_aShift[] = {24, 16, 8, 0};
			int NewColor = 0;

			// extra space
			CUIRect ColorBox, ColorSlots;

			pToolBox->HSplitTop(3.0f*13.0f, &Slot, pToolBox);
			Slot.VSplitMid(&ColorBox, &ColorSlots);
			ColorBox.HMargin(1.0f, &ColorBox);
			ColorBox.VMargin(6.0f, &ColorBox);

			for(int c = 0; c < 4; c++)
			{
				int v = (pProps[i].m_Value >> s_aShift[c])&0xff;
				NewColor |= UiDoValueSelector(((char *)&pIDs[i])+c, &Shifter, s_paTexts[c], v, 0, 255, 1, 1.0f, "Use left mouse button to drag and change the color value. Hold shift to be more precise.")<<s_aShift[c];

				if(c != 3)
				{
					ColorSlots.HSplitTop(13.0f, &Shifter, &ColorSlots);
					Shifter.HMargin(1.0f, &Shifter);
				}
			}

			// color picker
			vec4 Color = vec4(
				((pProps[i].m_Value >> s_aShift[0])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[1])&0xff)/255.0f,
				((pProps[i].m_Value >> s_aShift[2])&0xff)/255.0f,
				1.0f);

			ColorBox.Draw(Color, 0.0f, CUIRect::CORNER_NONE);
			static int s_ColorPicker;
			if(DoButton_Editor_Common(&s_ColorPicker, 0x0, 0, &ColorBox, 0, 0x0))
			{
				m_InitialPickerColor = RgbToHsv(vec3(Color.r, Color.g, Color.b));
				m_SelectedPickerColor = m_InitialPickerColor;
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 180, 180, this, PopupColorPicker);
			}

			if(m_InitialPickerColor != m_SelectedPickerColor)
			{
				m_InitialPickerColor = m_SelectedPickerColor;
				vec3 c = HsvToRgb(m_SelectedPickerColor);
				NewColor = ((int)(c.r * 255.0f)&0xff) << 24 | ((int)(c.g * 255.0f)&0xff) << 16 | ((int)(c.b * 255.0f)&0xff) << 8 | (pProps[i].m_Value&0xff);
			}

			if(NewColor != pProps[i].m_Value)
			{
				*pNewVal = NewColor;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_IMAGE)
		{
			char aBuf[64];
			if(pProps[i].m_Value < 0)
				str_copy(aBuf, "None", sizeof(aBuf));
			else
				str_format(aBuf, sizeof(aBuf),"%s", m_Map.m_lImages[pProps[i].m_Value]->m_aName);

			if(DoButton_Editor(&pIDs[i], aBuf, 0, &Shifter, 0, 0))
				PopupSelectImageInvoke(pProps[i].m_Value, UI()->MouseX(), UI()->MouseY());

			int r = PopupSelectImageResult();
			if(r >= -1)
			{
				*pNewVal = r;
				Change = i;
			}
		}
		else if(pProps[i].m_Type == PROPTYPE_SHIFT)
		{
			CUIRect Left, Right, Up, Down;
			Shifter.VSplitMid(&Left, &Up, 2.0f);
			Left.VSplitLeft(10.0f, &Left, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Right);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "X", 10.0f, TEXTALIGN_CENTER);
			Up.VSplitLeft(10.0f, &Up, &Shifter);
			Shifter.VSplitRight(10.0f, &Shifter, &Down);
			Shifter.Draw(vec4(1,1,1,0.5f), 0.0f, CUIRect::CORNER_NONE);
			UI()->DoLabel(&Shifter, "Y", 10.0f, TEXTALIGN_CENTER);
			if(DoButton_ButtonDec(&pIDs[i], "-", 0, &Left, 0, "Left"))
			{
				*pNewVal = 1;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+3, "+", 0, &Right, 0, "Right"))
			{
				*pNewVal = 2;
				Change = i;
			}
			if(DoButton_ButtonDec(((char *)&pIDs[i])+1, "-", 0, &Up, 0, "Up"))
			{
				*pNewVal = 4;
				Change = i;
			}
			if(DoButton_ButtonInc(((char *)&pIDs[i])+2, "+", 0, &Down, 0, "Down"))
			{
				*pNewVal = 8;
				Change = i;
			}
		}
	}

	return Change;
}